

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_extractor.cpp
# Opt level: O3

void __thiscall
r_exec::_TPX::filter_icst_components
          (_TPX *this,ICST *icst,uint64_t icst_index,
          vector<r_exec::_TPX::Component,_std::allocator<r_exec::_TPX::Component>_> *components)

{
  pointer pPVar1;
  _Object *p_Var2;
  ulong uVar3;
  void *pvVar4;
  pointer pCVar5;
  pointer pCVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  pointer pPVar10;
  
  uVar3 = (long)(icst->components).
                super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(icst->components).
                super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = 0xffffffffffffffff;
  if (-1 < (long)uVar3) {
    uVar8 = uVar3;
  }
  pvVar4 = operator_new__(uVar8);
  pCVar5 = (components->
           super__Vector_base<r_exec::_TPX::Component,_std::allocator<r_exec::_TPX::Component>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pCVar6 = (components->
           super__Vector_base<r_exec::_TPX::Component,_std::allocator<r_exec::_TPX::Component>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pCVar6 != pCVar5) {
    lVar9 = 0;
    uVar8 = 0;
    do {
      pPVar10 = (icst->components).
                super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pPVar1 = (icst->components).
               super__Vector_base<core::P<r_exec::_Fact>,_std::allocator<core::P<r_exec::_Fact>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pPVar10 != pPVar1) {
        do {
          p_Var2 = pPVar10->object;
          if (p_Var2 != (_Object *)0x0) {
            LOCK();
            (p_Var2->refCount).super___atomic_base<long>._M_i =
                 (p_Var2->refCount).super___atomic_base<long>._M_i + 1;
            UNLOCK();
          }
          pCVar5 = (components->
                   super__Vector_base<r_exec::_TPX::Component,_std::allocator<r_exec::_TPX::Component>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          if ((pCVar5[uVar8].discarded == false) && ((_Object *)pCVar5[uVar8].object == p_Var2)) {
            *(ulong *)((long)pvVar4 + lVar9 * 8) = uVar8;
            lVar9 = lVar9 + 1;
          }
          if (p_Var2 != (_Object *)0x0) {
            LOCK();
            (p_Var2->refCount).super___atomic_base<long>._M_i =
                 (p_Var2->refCount).super___atomic_base<long>._M_i + -1;
            UNLOCK();
            if ((p_Var2->refCount).super___atomic_base<long>._M_i < 1) {
              (**(code **)(*(long *)&(((LObject *)&p_Var2->_vptr__Object)->
                                     super_Object<r_code::LObject,_r_exec::LObject>).super_LObject +
                          8))();
            }
          }
          pPVar10 = pPVar10 + 1;
        } while (pPVar10 != pPVar1);
        pCVar5 = (components->
                 super__Vector_base<r_exec::_TPX::Component,_std::allocator<r_exec::_TPX::Component>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pCVar6 = (components->
                 super__Vector_base<r_exec::_TPX::Component,_std::allocator<r_exec::_TPX::Component>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)((long)pCVar6 - (long)pCVar5 >> 4));
    if (lVar9 != 0) {
      lVar7 = 0;
      do {
        pCVar5[*(long *)((long)pvVar4 + lVar7 * 8)].discarded = true;
        lVar7 = lVar7 + 1;
      } while (lVar9 != lVar7);
      goto LAB_00190dc7;
    }
  }
  pCVar5[icst_index].discarded = true;
LAB_00190dc7:
  operator_delete__(pvVar4);
  return;
}

Assistant:

void _TPX::filter_icst_components(ICST *icst, uint64_t icst_index, std::vector<Component> &components)
{
    uint64_t found_component_count = 0;
    uint64_t *found = new uint64_t[icst->components.size()];

    for (uint64_t j = 0; j < components.size(); ++j) {
        for (P<_Fact> component : icst->components) {
            if (components[j].discarded) {
                continue;
            }

            if (components[j].object == component) {
                found[found_component_count] = j;
                ++found_component_count;
            }
        }
    }

    if (found_component_count > 0) { // some of the icst components are already in the inputs: discard said components, keep the icst.
        for (uint64_t i = 0; i < found_component_count; ++i) {
            components[found[i]].discarded = true;
        }
    } else { // none of the icst components are in the inputs; this can only happen because the icst shares one timestamp with the TPX's target: discard the icst.
        components[icst_index].discarded = true;
    }

    delete[] found;
}